

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::ClassType::computeCycles(ClassType *this)

{
  bool bVar1;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar2;
  Type *pTVar3;
  ClassType *this_00;
  ClassPropertySymbol *prop;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar4;
  
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
  sVar4 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(&this->super_Scope);
  sVar2 = sVar4._M_begin.current;
  do {
    if (sVar2.current == sVar4._M_end.current.current) {
      (this->cachedHasCycles).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
      return;
    }
    pTVar3 = DeclaredType::getType((DeclaredType *)(sVar2.current + 1));
    this_00 = (ClassType *)pTVar3->canonical;
    if (this_00 == (ClassType *)0x0) {
      Type::resolveCanonical(pTVar3);
      this_00 = (ClassType *)pTVar3->canonical;
    }
    pTVar3 = (this_00->super_Type).canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(&this_00->super_Type);
      pTVar3 = (this_00->super_Type).canonical;
    }
    if (((pTVar3->super_Symbol).kind == ClassType) && (bVar1 = hasCycles(this_00), bVar1)) {
      return;
    }
    do {
      sVar2.current = (sVar2.current)->nextInScope;
      if (sVar2.current == (Symbol *)0x0) {
        sVar2.current = (Symbol *)0x0;
        break;
      }
    } while ((sVar2.current)->kind != ClassProperty);
  } while( true );
}

Assistant:

void ClassType::computeCycles() const {
    // Start out by setting hasCycles to true, so that if we call into
    // hasCycles() in a re-entrant fashion we'll see this result right away.
    ensureElaborated();
    cachedHasCycles = true;

    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        auto& propType = prop.getType().getCanonicalType();
        if (propType.isClass() && propType.as<ClassType>().hasCycles())
            return;
    }

    cachedHasCycles = false;
}